

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateCharacterLiteral(ExpressionEvalContext *ctx,ExprCharacterLiteral *expression)

{
  ExprBase *pEVar1;
  ExprCharacterLiteral *expression_local;
  ExpressionEvalContext *ctx_local;
  
  pEVar1 = &ExpressionContext::get<ExprCharacterLiteral>(ctx->ctx)->super_ExprBase;
  ExprCharacterLiteral::ExprCharacterLiteral
            ((ExprCharacterLiteral *)pEVar1,(expression->super_ExprBase).source,
             (expression->super_ExprBase).type,(expression->super_ExprBase).field_0x29);
  pEVar1 = CheckType(&expression->super_ExprBase,pEVar1);
  return pEVar1;
}

Assistant:

ExprBase* EvaluateCharacterLiteral(ExpressionEvalContext &ctx, ExprCharacterLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, expression->type, expression->value));
}